

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBufferTestUtil.cpp
# Opt level: O0

void deqp::gls::BufferTestUtil::fillWithRandomBytes(deUint8 *ptr,int numBytes,deUint32 seed)

{
  RandomValueIterator<unsigned_char> local_48;
  RandomValueIterator<unsigned_char> local_30;
  deUint32 local_18;
  int local_14;
  deUint32 seed_local;
  int numBytes_local;
  deUint8 *ptr_local;
  
  local_18 = seed;
  local_14 = numBytes;
  _seed_local = ptr;
  tcu::RandomValueIterator<unsigned_char>::begin(&local_30,seed,numBytes);
  tcu::RandomValueIterator<unsigned_char>::end();
  std::copy<tcu::RandomValueIterator<unsigned_char>,unsigned_char*>(&local_30,&local_48,_seed_local)
  ;
  tcu::RandomValueIterator<unsigned_char>::~RandomValueIterator(&local_48);
  tcu::RandomValueIterator<unsigned_char>::~RandomValueIterator(&local_30);
  return;
}

Assistant:

void fillWithRandomBytes (deUint8* ptr, int numBytes, deUint32 seed)
{
	std::copy(tcu::RandomValueIterator<deUint8>::begin(seed, numBytes), tcu::RandomValueIterator<deUint8>::end(), ptr);
}